

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cupdlp_linalg.c
# Opt level: O2

cupdlp_int cupdlp_twoNorm(CUPDLPwork *w,cupdlp_int n,cupdlp_float *x,cupdlp_float *res)

{
  double dVar1;
  
  dVar1 = nrm2(n,x,(cupdlp_int)x);
  *res = dVar1;
  return 0;
}

Assistant:

cupdlp_int cupdlp_twoNorm(CUPDLPwork *w, const cupdlp_int n,
                          const cupdlp_float *x, cupdlp_float *res) {
#ifndef CUPDLP_CPU
#ifndef SFLOAT
  CHECK_CUBLAS(cublasDnrm2(w->cublashandle, n, x, 1, res));
#else
  CHECK_CUBLAS(cublasSnrm2(w->cublashandle, n, x, 1, res));
#endif
#else
  *res = nrm2(n, x, 1);
#endif
  return 0;
}